

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O0

unsigned_long fmt::v8::detail::bit_cast<unsigned_long,void_const*>(void **from)

{
  unsigned_long to;
  void **from_local;
  
  return (unsigned_long)*from;
}

Assistant:

FMT_CONSTEXPR20 auto bit_cast(const From& from) -> To {
  static_assert(sizeof(To) == sizeof(From), "size mismatch");
#ifdef __cpp_lib_bit_cast
  if (is_constant_evaluated()) return std::bit_cast<To>(from);
#endif
  auto to = To();
  std::memcpy(&to, &from, sizeof(to));
  return to;
}